

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O0

void prvTidytidyMessageRelease(TidyMessageImpl *message)

{
  TidyMessageImpl *message_local;
  
  if (message != (TidyMessageImpl *)0x0) {
    (*message->tidyDoc->allocator->vtbl->free)(message->tidyDoc->allocator,message->arguments);
    (*message->tidyDoc->allocator->vtbl->free)(message->tidyDoc->allocator,message->messageDefault);
    (*message->tidyDoc->allocator->vtbl->free)(message->tidyDoc->allocator,message->message);
    (*message->tidyDoc->allocator->vtbl->free)
              (message->tidyDoc->allocator,message->messagePosDefault);
    (*message->tidyDoc->allocator->vtbl->free)(message->tidyDoc->allocator,message->messagePos);
    (*message->tidyDoc->allocator->vtbl->free)
              (message->tidyDoc->allocator,message->messageOutputDefault);
    (*message->tidyDoc->allocator->vtbl->free)(message->tidyDoc->allocator,message->messageOutput);
    (*message->tidyDoc->allocator->vtbl->free)(message->tidyDoc->allocator,message);
  }
  return;
}

Assistant:

void TY_(tidyMessageRelease)( TidyMessageImpl *message )
{
    if ( !message )
        return;
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->arguments );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messageDefault );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->message );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messagePosDefault );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messagePos );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messageOutputDefault );
    TidyDocFree( tidyDocToImpl(message->tidyDoc), message->messageOutput );
    TidyDocFree(tidyDocToImpl(message->tidyDoc), message); /* Issue #597 - and discard the message structure */
}